

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer piVar1;
  int iVar2;
  ParallelBFS *this;
  NodeId *x;
  pointer piVar3;
  long lVar4;
  double dVar5;
  environment env;
  communicator world;
  int m;
  double global_elapsed;
  double elapsed;
  int n;
  environment local_7b [2];
  allocator_type local_79;
  communicator local_78 [8];
  shared_count local_70;
  int local_64;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  double local_30;
  int local_28;
  int local_24;
  char **local_20;
  
  boost::mpi::environment::environment(local_7b,&local_24,&local_20,true);
  boost::mpi::communicator::communicator(local_78);
  iVar2 = boost::mpi::communicator::rank();
  if (iVar2 == 0) {
    __isoc99_scanf("%d %d",&local_28,&local_64);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,(long)local_28,(allocator_type *)&local_60);
    std::vector<int,_std::allocator<int>_>::vector(&local_60,(long)local_64,&local_79);
    for (piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        piVar1 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        piVar3 != local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish; piVar3 = piVar3 + 1) {
      __isoc99_scanf("%d",piVar3);
    }
    for (; piVar1 != local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish; piVar1 = piVar1 + 1) {
      __isoc99_scanf("%d",piVar1);
    }
    this = (ParallelBFS *)operator_new(0x68);
    ParallelBFS::ParallelBFS(this,local_78,&local_48,&local_60);
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    this = (ParallelBFS *)operator_new(0x68);
    ParallelBFS::ParallelBFS(this,local_78);
  }
  local_30 = (double)MPI_Wtime();
  ParallelBFS::calculate(this,0);
  dVar5 = (double)MPI_Wtime();
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)(dVar5 - local_30);
  boost::mpi::reduce<double,boost::mpi::minimum<double>>(local_78,&local_48,&local_60,0);
  iVar2 = boost::mpi::communicator::rank();
  if (iVar2 == 0) {
    main_cold_1();
  }
  if (0 < this->vertex_count) {
    lVar4 = 0;
    do {
      printf("%d: %d\n",(ulong)(uint)(this->first_vertex + (int)lVar4),
             (ulong)(uint)(this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->vertex_count);
  }
  piVar3 = (this->distance).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->edges).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->vertices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  operator_delete(this);
  boost::detail::shared_count::~shared_count(&local_70);
  boost::mpi::environment::~environment(local_7b);
  return 0;
}

Assistant:

int main(int argc, char *argv[1]) {
  mpi::environment env(argc, argv);
  mpi::communicator world;

  ParallelBFS *bfs;
  if (world.rank() == 0) {
    int n, m;
    scanf("%d %d", &n, &m);
    ParallelBFS::NodeList vertices((size_t)n), edges((size_t)m);
    for (ParallelBFS::NodeId &x : vertices)
      scanf("%d", &x);
    for (ParallelBFS::NodeId &x : edges)
      scanf("%d", &x);
    bfs = new ParallelBFS(world, vertices, edges);
  } else {
    bfs = new ParallelBFS(world);
  }

  mpi::timer timer;
  bfs->calculate(0);
  double elapsed = timer.elapsed(), global_elapsed;
  mpi::reduce(world, elapsed, global_elapsed, mpi::minimum<double>(), 0);
  if (world.rank() == 0)
    fprintf(stderr, "Running time: %lf s\n", global_elapsed);

  for (int i = 0; i < bfs->size(); ++i)
    printf("%d: %d\n", bfs->get_first_vertex() + i, bfs->get_distance(i));
  delete bfs;
  return 0;
}